

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

size_t __thiscall RelocBlockWrapper::maxEntriesNumInBlock(RelocBlockWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  RelocBlockWrapper *local_48;
  bufsize_t entriesNum;
  void *ptr;
  offset_t fileSize;
  offset_t entriesOffset;
  bufsize_t entriesSize;
  IMAGE_BASE_RELOCATION *reloc;
  RelocBlockWrapper *this_local;
  undefined4 extraout_var_01;
  
  if (this->cachedMaxNum == 0) {
    iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xc])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      this_local = (RelocBlockWrapper *)0x0;
    }
    else {
      iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x13])(this,2,0xffffffffffffffff);
      entriesOffset = CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x14])(this,2,0xffffffffffffffff);
      lVar3 = CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])();
      if (CONCAT44(extraout_var_02,iVar2) < lVar3 + entriesOffset) {
        entriesOffset = CONCAT44(extraout_var_02,iVar2) - lVar3;
      }
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,lVar3,1,entriesOffset,0);
      local_48 = (RelocBlockWrapper *)0x0;
      if (CONCAT44(extraout_var_03,iVar2) != 0) {
        local_48 = (RelocBlockWrapper *)(entriesOffset >> 1);
      }
      this->cachedMaxNum = (offset_t)local_48;
      this_local = local_48;
    }
  }
  else {
    this_local = (RelocBlockWrapper *)this->cachedMaxNum;
  }
  return (size_t)this_local;
}

Assistant:

size_t RelocBlockWrapper::maxEntriesNumInBlock()
{
    if (this->cachedMaxNum > 0) return this->cachedMaxNum;

    IMAGE_BASE_RELOCATION* reloc = (IMAGE_BASE_RELOCATION*) this->getPtr();
    if (!reloc) return 0;

    bufsize_t entriesSize = getFieldSize(ENTRIES_PTR);
    offset_t entriesOffset = getFieldOffset(ENTRIES_PTR);

    offset_t fileSize = m_Exe->getRawSize();
    if (entriesOffset + entriesSize > fileSize) {
        entriesSize = fileSize - entriesOffset; // truncate to fileSize
    }

    void *ptr = this->m_Exe->getContentAt(entriesOffset, Executable::RAW, entriesSize);

    bufsize_t entriesNum = 0;
    if (ptr) {
        entriesNum = entriesSize / sizeof(WORD); //sizeof(BASE_RELOCATION_ENTRY);
    }
    this->cachedMaxNum = entriesNum;
    return entriesNum;
}